

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O2

AssertionInfo * __thiscall
ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::operator*
          (Iterator *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  char *pcVar5;
  ContinuousPageStack<1UL> *this_00;
  
  uVar4 = (this->super_Iterator).nextTop;
  if (uVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x142,"(*this)","*this");
    if (!bVar2) goto LAB_00d4feaf;
    *puVar3 = 0;
    uVar4 = (this->super_Iterator).nextTop;
  }
  this_00 = &this->stack->super_ContinuousPageStack<1UL>;
  if (this_00->nextTop < uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x143,"(this->nextTop <= stack.nextTop)","this->nextTop <= stack.nextTop");
    if (!bVar2) {
LAB_00d4feaf:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = &this->stack->super_ContinuousPageStack<1UL>;
  }
  pcVar5 = ContinuousPageStack<1UL>::Buffer(this_00);
  return (AssertionInfo *)(pcVar5 + ((this->super_Iterator).nextTop - 0x10));
}

Assistant:

inline T &ContinuousPageStackOfFixedElements<T, InitialPageCount>::Iterator::operator *() const
{
    Assert(*this);
    Assert(this->nextTop <= stack.nextTop);
    return *reinterpret_cast<T *>(&stack.Buffer()[this->nextTop - sizeof(T)]);
}